

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufref.c
# Opt level: O1

void Curl_bufref_free(bufref *br)

{
  if ((br->ptr != (uchar *)0x0) && (br->dtor != (_func_void_void_ptr *)0x0)) {
    (*br->dtor)(br->ptr);
  }
  br->dtor = (_func_void_void_ptr *)0x0;
  br->ptr = (uchar *)0x0;
  br->len = 0;
  return;
}

Assistant:

void Curl_bufref_free(struct bufref *br)
{
  DEBUGASSERT(br);
  DEBUGASSERT(br->signature == SIGNATURE);
  DEBUGASSERT(br->ptr || !br->len);

  if(br->ptr && br->dtor)
    br->dtor((void *) br->ptr);

  br->dtor = NULL;
  br->ptr = NULL;
  br->len = 0;
}